

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O0

void __thiscall fp_remover::classes::Character::Character(Character *this)

{
  Character *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  this->character_fp_start = -1;
  this->character_fp_end = -1;
  std::__cxx11::string::operator=((string *)&this->name,"n/a");
  return;
}

Assistant:

Character::Character()
{
	character_fp_start = -1;
	character_fp_end = -1;
	name = "n/a";
}